

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O3

QFunctionPointer __thiscall QLibrary::resolve(QLibrary *this,char *symbol)

{
  bool bVar1;
  QFunctionPointer p_Var2;
  quintptr qVar3;
  
  qVar3 = (this->d).d;
  if (((uint)qVar3 & 7) != 1) {
    bVar1 = load(this);
    if (!bVar1) {
      return (QFunctionPointer)0x0;
    }
    qVar3 = (this->d).d;
  }
  if ((((QLibraryPrivate *)(qVar3 & 0xfffffffffffffff8))->pHnd).super_QBasicAtomicPointer<void>.
      _q_value._M_b._M_p == (__pointer_type)0x0) {
    return (QFunctionPointer)0x0;
  }
  p_Var2 = QLibraryPrivate::resolve_sys((QLibraryPrivate *)(qVar3 & 0xfffffffffffffff8),symbol);
  return p_Var2;
}

Assistant:

QFunctionPointer QLibrary::resolve(const char *symbol)
{
    if (!isLoaded() && !load())
        return nullptr;
    return d->resolve(symbol);
}